

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDefines.h
# Opt level: O2

KString * __thiscall
KDIS::GetErrorText_abi_cxx11_(KString *__return_storage_ptr__,KDIS *this,KUINT16 ErrorCode)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_16;
  allocator<char> local_15;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  allocator<char> local_10;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    __s = "No Errors. ";
    __a = &local_9;
    break;
  case 1:
    __s = "Buffer Is Too Small. ";
    __a = &local_a;
    break;
  case 2:
    __s = "Buffer Does Not Contain Enough Information To Decode. ";
    __a = &local_b;
    break;
  case 3:
    __s = "String Size Too Big. ";
    __a = &local_c;
    break;
  case 4:
    __s = "Data Type Is Too Large. ";
    __a = &local_d;
    break;
  case 5:
    __s = "Incorrect PDU Type Specified In Header. ";
    __a = &local_e;
    break;
  case 6:
    __s = "Could Not Open File For Reading/Writing. ";
    __a = &local_f;
    break;
  case 7:
    __s = "Parameter Is Out Of Bounds/Range Of Acceptable Values. ";
    __a = &local_10;
    break;
  case 8:
    __s = "Invalid Data. ";
    __a = &local_11;
    break;
  case 9:
    __s = "Unsupported Data Type, Can Not Decode. ";
    __a = &local_12;
    break;
  case 10:
    __s = "Invalid Operation. ";
    __a = &local_13;
    break;
  case 0xb:
    __s = "PDU Is Too Large. PDU Must Not Exceed 8192 Bytes.";
    __a = &local_14;
    break;
  case 0xc:
    __s = "Socket error.";
    __a = &local_15;
    break;
  default:
    __s = "Unknown KDIS Error. ";
    __a = &local_16;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

static KString GetErrorText( KUINT16 ErrorCode )
{
    switch( ErrorCode )
    {
        case NO_ERRORS:
            return "No Errors. ";
        case BUFFER_TOO_SMALL:
            return "Buffer Is Too Small. ";
        case NOT_ENOUGH_DATA_IN_BUFFER:
            return "Buffer Does Not Contain Enough Information To Decode. ";
        case STRING_PDU_SIZE_TOO_BIG:
            return "String Size Too Big. ";
        case DATA_TYPE_TOO_LARGE:
            return "Data Type Is Too Large. ";
        case WRONG_PDU_TYPE_IN_HEADER:
            return "Incorrect PDU Type Specified In Header. ";
        case FILE_NOT_OPEN:
            return "Could Not Open File For Reading/Writing. ";
        case OUT_OF_BOUNDS:
            return "Parameter Is Out Of Bounds/Range Of Acceptable Values. ";
        case INVALID_DATA:
            return "Invalid Data. ";
        case UNSUPPORTED_DATATYPE:
            return "Unsupported Data Type, Can Not Decode. ";
        case INVALID_OPERATION:
            return "Invalid Operation. ";
        case PDU_TOO_LARGE:
            return "PDU Is Too Large. PDU Must Not Exceed 8192 Bytes.";
        case CONNECTION_SOCKET_ERROR:
            return "Socket error.";
        default:
            return "Unknown KDIS Error. ";
    }
}